

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O2

bool __thiscall Gluco::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  RegionAllocator<unsigned_int> *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  Lit LVar4;
  uint *puVar5;
  Clause *pCVar6;
  vec<unsigned_int> *pvVar7;
  uint *puVar8;
  Clause *other;
  int iVar9;
  ulong uVar10;
  Ref r;
  undefined7 in_register_00000031;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Queue<unsigned_int> *this_01;
  lbool local_6d;
  Var best;
  RegionAllocator<unsigned_int> *local_68;
  uint local_60;
  uint local_5c;
  SimpSolver *local_58;
  undefined4 local_4c;
  int local_48;
  Ref local_44;
  OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted> *local_40;
  Queue<unsigned_int> *local_38;
  
  local_4c = (undefined4)CONCAT71(in_register_00000031,verbose);
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                  ,0x163,"bool Gluco::SimpSolver::backwardSubsumptionCheck(bool)");
  }
  local_38 = &this->subsumption_queue;
  local_68 = &(this->super_Solver).ca.super_RegionAllocator<unsigned_int>;
  local_40 = &this->occurs;
  local_60 = 0;
  local_5c = 0;
  this_01 = local_38;
  iVar14 = 0;
  local_58 = this;
  do {
    do {
      this_00 = local_68;
      iVar2 = (this->subsumption_queue).end;
      iVar12 = 0;
      iVar13 = (this->subsumption_queue).first;
      iVar9 = iVar2 - iVar13;
      if (iVar2 < iVar13) {
        iVar12 = (this->subsumption_queue).buf.sz;
      }
      iVar2 = iVar12 + iVar9;
      if ((iVar2 == 0 || SCARRY4(iVar12,iVar9) != iVar2 < 0) &&
         ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) {
        return true;
      }
      if ((this->super_Solver).asynch_interrupt == true) {
        Queue<unsigned_int>::clear(this_01,false);
        this->bwdsub_assigns = (this->super_Solver).trail.sz;
        return true;
      }
      if (iVar2 == 0) {
        iVar2 = this->bwdsub_assigns;
        if (iVar2 < (this->super_Solver).trail.sz) {
          this->bwdsub_assigns = iVar2 + 1;
          uVar3 = (this->super_Solver).trail.data[iVar2].x;
          puVar5 = RegionAllocator<unsigned_int>::operator[](local_68,this->bwdsub_tmpunit);
          puVar5[3] = uVar3;
          pCVar6 = (Clause *)RegionAllocator<unsigned_int>::operator[](this_00,this->bwdsub_tmpunit)
          ;
          Clause::calcAbstraction(pCVar6);
          Queue<unsigned_int>::insert(this_01,this->bwdsub_tmpunit);
        }
      }
      uVar3 = Queue<unsigned_int>::peek(this_01);
      Queue<unsigned_int>::pop(this_01);
      pCVar6 = (Clause *)RegionAllocator<unsigned_int>::operator[](local_68,uVar3);
      uVar10 = *(ulong *)&pCVar6->header;
    } while ((uVar10 & 3) != 0);
    if ((((char)local_4c != '\0') && (1 < (this->super_Solver).verbosity)) &&
       (iVar13 = iVar14 + 1, iVar2 = iVar14 % 1000, iVar14 = iVar13, iVar2 == 0)) {
      iVar2 = (this->subsumption_queue).end;
      iVar12 = 0;
      iVar13 = (this->subsumption_queue).first;
      if (iVar2 < iVar13) {
        iVar12 = (this->subsumption_queue).buf.sz;
      }
      printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",
             (ulong)(uint)((iVar2 - iVar13) + iVar12),(ulong)local_5c,(ulong)local_60);
      uVar10 = *(ulong *)&pCVar6->header;
    }
    iVar2 = (int)(uVar10 >> 0x20);
    if (iVar2 < 2) {
      local_6d.value =
           (byte)*(int *)&pCVar6[1].header & 1 ^
           (this->super_Solver).assigns.data[*(int *)&pCVar6[1].header >> 1].value;
      bVar1 = lbool::operator==(&local_6d,(lbool)0x0);
      if (!bVar1) {
        __assert_fail("c.size() > 1 || value(c[0]) == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                      ,0x17c,"bool Gluco::SimpSolver::backwardSubsumptionCheck(bool)");
      }
      iVar2 = *(int *)&(pCVar6->header).field_0x4;
    }
    iVar13 = *(int *)&pCVar6[1].header >> 1;
    pvVar7 = (local_40->occs).data;
    best = iVar13;
    for (lVar11 = 4; lVar11 + -3 < (long)iVar2; lVar11 = lVar11 + 1) {
      iVar12 = *(int *)(&(pCVar6->header).field_0x0 + lVar11 * 4) >> 1;
      if (pvVar7[iVar12].sz < pvVar7[iVar13].sz) {
        iVar13 = iVar12;
        best = iVar12;
      }
    }
    local_48 = iVar14;
    local_44 = uVar3;
    pvVar7 = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::lookup
                       (local_40,&best);
    puVar5 = pvVar7->data;
    iVar2 = 0;
    while ((this_01 = local_38, iVar14 = local_48, iVar2 < pvVar7->sz &&
           ((undefined1  [12])((undefined1  [12])pCVar6->header & (undefined1  [12])0x3) ==
            (undefined1  [12])0x0))) {
      puVar8 = RegionAllocator<unsigned_int>::operator[](local_68,puVar5[iVar2]);
      if (((*puVar8 & 3) == 0) && (r = puVar5[iVar2], r != local_44)) {
        if (this->subsumption_lim != -1) {
          puVar8 = RegionAllocator<unsigned_int>::operator[](local_68,r);
          if (this->subsumption_lim <= (int)puVar8[1]) goto LAB_004bb988;
          r = puVar5[iVar2];
        }
        other = (Clause *)RegionAllocator<unsigned_int>::operator[](local_68,r);
        LVar4 = Clause::subsumes(pCVar6,other);
        this = local_58;
        if (LVar4.x != -1) {
          if (LVar4.x == -2) {
            local_5c = local_5c + 1;
            removeClause(local_58,puVar5[iVar2]);
          }
          else {
            bVar1 = strengthenClause(local_58,puVar5[iVar2],(Lit)(LVar4.x ^ 1));
            if (!bVar1) {
              return false;
            }
            local_60 = local_60 + 1;
            iVar2 = iVar2 - (uint)(LVar4.x >> 1 == best);
            this = local_58;
          }
        }
      }
LAB_004bb988:
      iVar2 = iVar2 + 1;
    }
  } while( true );
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()){

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt){
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break; }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()){
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit); }

        CRef    cr = subsumption_queue.peek(); subsumption_queue.pop();
        Clause& c  = ca[cr];

        if (c.mark()) continue;

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(), subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True);    // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size())
                best = var(c[i]);

        // Search all candidates:
        vec<CRef>& _cs = occurs.lookup(best);
        CRef*       cs = (CRef*)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (!ca[cs[j]].mark() &&  cs[j] != cr && (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)){
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error){
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l))
                        return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best)
                        j--;
                }
            }
    }

    return true;
}